

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O2

void rol_36(void)

{
  ubyte uVar1;
  bool bVar2;
  
  except = '\0';
  bVar2 = carry_f != '\0';
  uVar1 = getbyte(pc);
  temp2 = uVar1 + x_reg;
  carry_f = RAM[temp2] & 0x80;
  result_f = RAM[temp2] * '\x02' | bVar2;
  RAM[temp2] = result_f;
  pc = pc + 1;
  return;
}

Assistant:

void rol_36(void) {
    ubyte oldcar;
    CLE;
    oldcar = carry_f;

    result_f = RAM[temp2 = getbyte(pc) + x_reg];
    carry_f = result_f & 0x80;
    result_f <<= 1;

    if (oldcar) result_f++;

    RAM[temp2] = result_f;
    pc++;
}